

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_zip.c
# Opt level: O3

wchar_t zip_read_data_zipx_zstd(archive_read *a,void **buff,size_t *size,int64_t *offset)

{
  zip *zip;
  uint uVar1;
  wchar_t wVar2;
  size_t sVar3;
  char *pcVar4;
  ZSTD_DStream *zds;
  uchar *puVar5;
  int error_number;
  ssize_t bytes_avail;
  ZSTD_inBuffer in;
  size_t local_68;
  ZSTD_inBuffer local_60;
  ZSTD_outBuffer local_48;
  
  zip = (zip *)a->format->data;
  local_68 = 0;
  if (zip->decompress_init == '\0') {
    if (zip->zstdstream_valid != '\0') {
      ZSTD_freeDStream(zip->zstdstream);
      zip->zstdstream_valid = '\0';
    }
    zds = ZSTD_createDStream();
    zip->zstdstream = zds;
    sVar3 = ZSTD_initDStream(zds);
    uVar1 = ZSTD_isError(sVar3);
    if (uVar1 != 0) {
      pcVar4 = ZSTD_getErrorName(sVar3);
      archive_set_error(&a->archive,-1,"Error initializing zstd decompressor: %s",pcVar4);
      return L'\xffffffe7';
    }
    zip->zstdstream_valid = '\x01';
    free(zip->uncompressed_buffer);
    sVar3 = ZSTD_DStreamOutSize();
    zip->uncompressed_buffer_size = sVar3;
    puVar5 = (uchar *)malloc(sVar3);
    zip->uncompressed_buffer = puVar5;
    if (puVar5 == (uchar *)0x0) {
      pcVar4 = "No memory for Zstd decompression";
      error_number = 0xc;
      goto LAB_005c7f71;
    }
    zip->decompress_init = '\x01';
  }
  local_60.src = __archive_read_ahead(a,1,(ssize_t *)&local_68);
  if (-1 < (long)local_68) {
    local_60.size = local_68;
    if (zip->entry_bytes_remaining < (long)local_68) {
      local_60.size = zip->entry_bytes_remaining;
    }
    if (0 < (long)local_60.size) {
      local_60.pos = 0;
      local_48.dst = zip->uncompressed_buffer;
      local_48.size = zip->uncompressed_buffer_size;
      local_48.pos = 0;
      sVar3 = ZSTD_decompressStream(zip->zstdstream,&local_48,&local_60);
      uVar1 = ZSTD_isError(sVar3);
      if (uVar1 != 0) {
        pcVar4 = ZSTD_getErrorName(sVar3);
        archive_set_error(&a->archive,-1,"Error during zstd decompression: %s",pcVar4);
        return L'\xffffffe2';
      }
      if (((sVar3 == 0) && (local_60.pos == local_60.size)) && (local_48.pos < local_48.size)) {
        zip->end_of_entry = '\x01';
        ZSTD_freeDStream(zip->zstdstream);
        zip->zstdstream_valid = '\0';
      }
      sVar3 = local_60.pos;
      __archive_read_consume(a,local_60.pos);
      zip->entry_bytes_remaining = zip->entry_bytes_remaining - sVar3;
      zip->entry_compressed_bytes_read = zip->entry_compressed_bytes_read + sVar3;
      zip->entry_uncompressed_bytes_read = zip->entry_uncompressed_bytes_read + local_48.pos;
      *size = local_48.pos;
      *buff = zip->uncompressed_buffer;
      wVar2 = consume_optional_marker(a,zip);
      return wVar2;
    }
  }
  pcVar4 = "Truncated zstd file body";
  error_number = 0x54;
LAB_005c7f71:
  archive_set_error(&a->archive,error_number,pcVar4);
  return L'\xffffffe2';
}

Assistant:

static int
zip_read_data_zipx_zstd(struct archive_read *a, const void **buff,
    size_t *size, int64_t *offset)
{
	struct zip *zip = (struct zip *)(a->format->data);
	ssize_t bytes_avail = 0, in_bytes, to_consume;
	const void *compressed_buff;
	int r;
	size_t ret;
	uint64_t total_out;
	ZSTD_outBuffer out;
	ZSTD_inBuffer in;

	(void) offset; /* UNUSED */

	/* Initialize decompression context if we're here for the first time. */
	if(!zip->decompress_init) {
		r = zipx_zstd_init(a, zip);
		if(r != ARCHIVE_OK)
			return r;
	}

	/* Fetch more compressed bytes */
	compressed_buff = __archive_read_ahead(a, 1, &bytes_avail);
	if(bytes_avail < 0) {
		archive_set_error(&a->archive, ARCHIVE_ERRNO_FILE_FORMAT,
		    "Truncated zstd file body");
		return (ARCHIVE_FATAL);
	}

	in_bytes = zipmin(zip->entry_bytes_remaining, bytes_avail);
	if(in_bytes < 1) {
		/* zstd doesn't complain when caller feeds avail_in == 0.
		 * It will actually return success in this case, which is
		 * undesirable. This is why we need to make this check
		 * manually. */
		archive_set_error(&a->archive, ARCHIVE_ERRNO_FILE_FORMAT,
		    "Truncated zstd file body");
		return (ARCHIVE_FATAL);
	}

	/* Setup buffer boundaries */
	in.src = compressed_buff;
	in.size = in_bytes;
	in.pos = 0;
	out = (ZSTD_outBuffer) { zip->uncompressed_buffer, zip->uncompressed_buffer_size, 0 };

	/* Perform the decompression. */
	ret = ZSTD_decompressStream(zip->zstdstream, &out, &in);
	if (ZSTD_isError(ret)) {
		archive_set_error(&a->archive, ARCHIVE_ERRNO_MISC,
			"Error during zstd decompression: %s",
			ZSTD_getErrorName(ret));
		return (ARCHIVE_FATAL);
	}

	/* Check end of the stream. */
	if (ret == 0) {
		if ((in.pos == in.size) && (out.pos < out.size)) {
			zip->end_of_entry = 1;
			ZSTD_freeDStream(zip->zstdstream);
			zip->zstdstream_valid = 0;
		}
	}

	/* Update the pointers so decompressor can continue decoding. */
	to_consume = in.pos;
	__archive_read_consume(a, to_consume);

	total_out = out.pos;

	zip->entry_bytes_remaining -= to_consume;
	zip->entry_compressed_bytes_read += to_consume;
	zip->entry_uncompressed_bytes_read += total_out;

	/* Give libarchive its due. */
	*size = total_out;
	*buff = zip->uncompressed_buffer;

	/* Seek for optional marker, like in other entries. */
	r = consume_optional_marker(a, zip);
	if(r != ARCHIVE_OK)
		return r;

	return ARCHIVE_OK;
}